

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DInstance::createTexture(TextureGather2DInstance *this)

{
  CompareMode compare_;
  WrapMode wrapS_;
  WrapMode wrapT_;
  FilterMode minFilter_;
  FilterMode magFilter_;
  undefined8 this_00;
  int iVar1;
  int iVar2;
  deUint32 seed;
  TestContext *pTVar3;
  Texture2D *pTVar4;
  ConstPixelBufferAccess *dst;
  CommandLine *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  TextureBinding *this_03;
  SharedPtrStateBase *extraout_RDX;
  long in_RSI;
  TextureBindingSp TVar6;
  Vector<int,_2> local_378;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  LogImage local_2f0;
  MessageBuilder local_260;
  ConstPixelBufferAccess *local_e0;
  PixelBufferAccess *level;
  int levelNdx;
  int levelEnd;
  int levelBegin;
  undefined1 local_bc [8];
  Sampler sampler;
  undefined1 local_70 [8];
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  TextureFormatInfo texFmtInfo;
  TestLog *log;
  TextureGather2DInstance *this_local;
  
  pTVar3 = Context::getTestContext(*(Context **)(in_RSI + 8));
  texFmtInfo.lookupBias.m_data._8_8_ = tcu::TestContext::getLog(pTVar3);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)
             &texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
              field_0x8,(TextureFormat *)(in_RSI + 0x218));
  pTVar4 = (Texture2D *)operator_new(0x50);
  iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x264));
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(in_RSI + 0x264));
  tcu::Texture2D::Texture2D(pTVar4,(TextureFormat *)(in_RSI + 0x218),iVar1,iVar2);
  de::DefaultDeleter<tcu::Texture2D>::DefaultDeleter
            ((DefaultDeleter<tcu::Texture2D> *)&sampler.field_0x37);
  de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::MovePtr
            ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70,pTVar4);
  compare_ = *(CompareMode *)(in_RSI + 0x220);
  wrapS_ = *(WrapMode *)(in_RSI + 0x224);
  wrapT_ = *(WrapMode *)(in_RSI + 0x228);
  minFilter_ = *(FilterMode *)(in_RSI + 0x240);
  magFilter_ = *(FilterMode *)(in_RSI + 0x244);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelEnd,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            ((Sampler *)local_bc,wrapS_,wrapT_,REPEAT_GL,minFilter_,magFilter_,0.0,true,compare_,0,
             (Vec4 *)&levelEnd,false,MODE_DEPTH);
  levelNdx = *(int *)(in_RSI + 0x248);
  pTVar4 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::operator->
                     ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70);
  level._4_4_ = tcu::TextureLevelPyramid::getNumLevels(&pTVar4->super_TextureLevelPyramid);
  for (level._0_4_ = levelNdx; (int)level < level._4_4_; level._0_4_ = (int)level + 1) {
    pTVar4 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::
             operator->((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70)
    ;
    tcu::Texture2D::allocLevel(pTVar4,(int)level);
    pTVar4 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::
             operator->((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70)
    ;
    dst = &tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,(int)level)->
           super_ConstPixelBufferAccess;
    local_e0 = dst;
    pTVar3 = Context::getTestContext(*(Context **)(in_RSI + 8));
    this_01 = tcu::TestContext::getCommandLine(pTVar3);
    seed = tcu::CommandLine::getBaseSeed(this_01);
    fillWithRandomColorTiles
              ((PixelBufferAccess *)dst,
               (Vec4 *)&texture.
                        super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data
                        .field_0x8,(Vec4 *)(texFmtInfo.valueMin.m_data + 2),seed);
    this_00 = texFmtInfo.lookupBias.m_data._8_8_;
    de::toString<int>(&local_330,(int *)&level);
    std::operator+(&local_310,"InputTextureLevel",&local_330);
    de::toString<int>(&local_370,(int *)&level);
    std::operator+(&local_350,"Input texture, level ",&local_370);
    tcu::LogImage::LogImage
              (&local_2f0,&local_310,&local_350,local_e0,QP_IMAGE_COMPRESSION_MODE_BEST);
    this_02 = tcu::TestLog::operator<<((TestLog *)this_00,&local_2f0);
    tcu::TestLog::operator<<(&local_260,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_260,(char (*) [31])"Note: texture level\'s size is ");
    iVar1 = tcu::ConstPixelBufferAccess::getWidth(local_e0);
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(local_e0);
    tcu::Vector<int,_2>::Vector(&local_378,iVar1,iVar2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_378);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_260);
    tcu::LogImage::~LogImage(&local_2f0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
  }
  pTVar4 = de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::operator*
                     ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70);
  swizzleTexture((Texture2D *)(in_RSI + 0x288),pTVar4,(MaybeTextureSwizzle *)(in_RSI + 0x22c));
  this_03 = (TextureBinding *)operator_new(0x68);
  pTVar4 = de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::release
                     ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70);
  TextureBinding::TextureBinding(this_03,pTVar4,(Sampler *)local_bc);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)this,this_03);
  de::details::MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~MovePtr
            ((MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)local_70);
  TVar6.m_state = extraout_RDX;
  TVar6.m_ptr = (TextureBinding *)this;
  return TVar6;
}

Assistant:

TextureBindingSp TextureGather2DInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2D>			texture		= MovePtr<tcu::Texture2D>(new tcu::Texture2D(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
			log << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
				<< TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}